

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileFromDatabase
          (DescriptorPool *this,FileDescriptorProto *proto,DeferredValidation *deferred_validation)

{
  Impl<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  iterator iVar1;
  FunctionRef<void_()> args;
  FileDescriptor *result;
  anon_class_32_4_3cd23a31 build_file;
  ErrorCollector local_70;
  _Head_base<0UL,_google::protobuf::DescriptorBuilder_*,_false> local_68;
  ErrorCollector *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  absl::lts_20250127::Mutex::AssertHeld(this->mutex_);
  this->build_started_ = true;
  this_01 = &((this->tables_)._M_t.
              super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl
             )->known_bad_files_;
  iVar1 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          ::find<std::__cxx11::string>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                      *)this_01,
                     (key_arg<std::__cxx11::basic_string<char>_> *)
                     ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::AssertNotDebugCapacity
            (&this_01->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  if (iVar1.ctrl_ == (ctrl_t *)0x0) {
    local_50 = &local_70;
    this_00 = (Impl<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)
              (this->dispatcher_)._M_t.
              super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
              .
              super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
              ._M_head_impl;
    local_48 = this;
    local_40 = deferred_validation;
    local_38 = proto;
    if (this_00 == (Impl<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0) {
      DescriptorBuilder::New
                ((DescriptorBuilder *)&stack0xffffffffffffff98,this,
                 (this->tables_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl,deferred_validation,this->default_error_collector_);
      local_70._vptr_ErrorCollector =
           (_func_int **)DescriptorBuilder::BuildFile(local_68._M_head_impl,proto);
      std::
      unique_ptr<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
      ::~unique_ptr((unique_ptr<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
                     *)&stack0xffffffffffffff98);
    }
    else {
      args.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorPool::BuildFileFromDatabase(google::protobuf::FileDescriptorProto_const&,google::protobuf::DescriptorPool::DeferredValidation&)const::__0,void>
      ;
      args.ptr_.obj = &stack0xffffffffffffffb0;
      absl::lts_20250127::internal_any_invocable::
      Impl<void_(absl::lts_20250127::FunctionRef<void_()>)_const>::operator()(this_00,args);
    }
    if ((FileDescriptor *)local_70._vptr_ErrorCollector == (FileDescriptor *)0x0) {
      local_30 = &((this->tables_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                  _M_head_impl)->known_bad_files_;
      key_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
      ::EmplaceDecomposable::operator()
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                  *)&stack0xffffffffffffff98,&stack0xffffffffffffffd0,key_00,key_00);
    }
  }
  else {
    local_70._vptr_ErrorCollector = (_func_int **)0x0;
  }
  return (FileDescriptor *)local_70._vptr_ErrorCollector;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileFromDatabase(
    const FileDescriptorProto& proto,
    DeferredValidation& deferred_validation) const {
  mutex_->AssertHeld();
  build_started_ = true;
  if (tables_->known_bad_files_.contains(proto.name())) {
    return nullptr;
  }
  const FileDescriptor* result;
  const auto build_file = [&] {
    result = DescriptorBuilder::New(this, tables_.get(), deferred_validation,
                                    default_error_collector_)
                 ->BuildFile(proto);
  };
  if (dispatcher_ != nullptr) {
    (*dispatcher_)(build_file);
  } else {
    build_file();
  }
  if (result == nullptr) {
    tables_->known_bad_files_.insert(proto.name());
  }
  return result;
}